

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnSimdLaneOp(TypeChecker *this,Opcode opcode,uint64_t lane_idx)

{
  uint32_t uVar1;
  Enum EVar2;
  uint32_t lane_count;
  uint64_t lane_idx_local;
  TypeChecker *this_local;
  Opcode opcode_local;
  Result result;
  
  this_local._0_4_ = opcode.enum_;
  Result::Result((Result *)((long)&this_local + 4),Error);
  uVar1 = Opcode::GetSimdLaneCount((Opcode *)&this_local);
  if (uVar1 <= lane_idx) {
    PrintError(this,"lane index must be less than %d (got %lu)",(ulong)uVar1,lane_idx);
  }
  EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local);
  if ((EVar2 - I8X16ExtractLaneS < 2) ||
     ((EVar2 != I8X16ReplaceLane &&
      ((EVar2 - I16X8ExtractLaneS < 2 ||
       ((EVar2 != I16X8ReplaceLane &&
        ((EVar2 == I32X4ExtractLane ||
         ((EVar2 != I32X4ReplaceLane &&
          ((EVar2 == I64X2ExtractLane ||
           ((EVar2 != I64X2ReplaceLane &&
            ((EVar2 == F32X4ExtractLane ||
             ((EVar2 != F32X4ReplaceLane && (EVar2 == F64X2ExtractLane)))))))))))))))))))) {
    this_local._4_4_ = CheckOpcode1(this,this_local._0_4_);
  }
  else {
    this_local._4_4_ = CheckOpcode2(this,this_local._0_4_);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnSimdLaneOp(Opcode opcode, uint64_t lane_idx) {
  Result result = Result::Error;
  uint32_t lane_count = opcode.GetSimdLaneCount();
  if (lane_idx >= lane_count) {
    PrintError("lane index must be less than %d (got %" PRIu64 ")", lane_count,
               lane_idx);
  }

  switch (opcode) {
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I32X4ExtractLane:
    case Opcode::F32X4ExtractLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::F64X2ExtractLane:
      result = CheckOpcode1(opcode);
      break;
    case Opcode::I8X16ReplaceLane:
    case Opcode::I16X8ReplaceLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::F64X2ReplaceLane:
      result = CheckOpcode2(opcode);
      break;
    default:
      WABT_UNREACHABLE;
  }
  return result;
}